

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQTable::Mark(SQTable *this,SQCollectable **chain)

{
  _func_int **pp_Var1;
  SQCollectable_conflict *pSVar2;
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQInteger i;
  SQInteger len;
  byte *o;
  
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    (in_RDI->super_SQRefCounted)._uiRef = (in_RDI->super_SQRefCounted)._uiRef | 0x80000000;
    if (in_RDI[1].super_SQRefCounted._vptr_SQRefCounted != (_func_int **)0x0) {
      pp_Var1 = in_RDI[1].super_SQRefCounted._vptr_SQRefCounted;
      (**(code **)(*pp_Var1 + 0x20))(pp_Var1,in_RSI);
    }
    pSVar2 = in_RDI[1]._next;
    for (o = (byte *)0x0; (long)o < (long)pSVar2;
        o = (byte *)((long)&(((SQObjectPtr *)o)->super_SQObject)._type + 1)) {
      SQSharedState::MarkObject((SQObjectPtr *)o,(SQCollectable_conflict **)in_RDI);
      SQSharedState::MarkObject((SQObjectPtr *)o,(SQCollectable_conflict **)in_RDI);
    }
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQTable::Mark(SQCollectable **chain)
{
    START_MARK()
        if(_delegate) _delegate->Mark(chain);
        SQInteger len = _numofnodes;
        for(SQInteger i = 0; i < len; i++){
            SQSharedState::MarkObject(_nodes[i].key, chain);
            SQSharedState::MarkObject(_nodes[i].val, chain);
        }
    END_MARK()
}